

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_functions.hpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::VariableReturnBindData::Deserialize
          (Deserializer *deserializer,ScalarFunction *bound_function)

{
  undefined8 *puVar1;
  LogicalType stype;
  Deserializer local_50 [24];
  LogicalType local_38 [24];
  
  (**(code **)(*(long *)bound_function + 0x10))(bound_function,100,"variable_return_type");
  (**(code **)(*(long *)bound_function + 0x30))(bound_function);
  duckdb::LogicalType::Deserialize(local_50);
  (**(code **)(*(long *)bound_function + 0x38))(bound_function);
  (**(code **)(*(long *)bound_function + 0x18))(bound_function);
  puVar1 = (undefined8 *)operator_new(0x20);
  duckdb::LogicalType::LogicalType(local_38,(LogicalType *)local_50);
  *puVar1 = &PTR__VariableReturnBindData_00891490;
  duckdb::LogicalType::LogicalType((LogicalType *)(puVar1 + 1),local_38);
  duckdb::LogicalType::~LogicalType(local_38);
  *(undefined8 **)deserializer = puVar1;
  duckdb::LogicalType::~LogicalType((LogicalType *)local_50);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

static unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, ScalarFunction &bound_function) {
		auto stype = deserializer.ReadProperty<LogicalType>(100, "variable_return_type");
		return make_uniq<VariableReturnBindData>(std::move(stype));
	}